

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int length;
  UdpTools *pUVar1;
  char *pcVar2;
  string local_200;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8 [8];
  string message;
  string local_190;
  allocator<char> local_169;
  string local_168 [39];
  allocator<char> local_141;
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [39];
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [36];
  undefined4 local_a4;
  UdpTools *local_a0;
  UdpTools *p_udpSender;
  string ifaceName;
  string local_70 [8];
  string port;
  allocator<char> local_39;
  string local_38 [8];
  string sendAddress;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  sendAddress.field_2._8_8_ = argv;
  if (argc < 3) {
    printf("\nUsage: %s <address> <port>\n\nExample: %s ff02::5:6 12345\n\n",*argv,*argv);
    return 1;
  }
  if ((argc != 3) && (argc != 4)) {
    printf("Usage: send address port. Example send ff02::5:6 12345\n");
    printf(
          "Usage (need be root): send iface-name address port. Example sudo send eth0 ff02::5:6 12345\n"
          );
    return -1;
  }
  pcVar2 = argv[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,pcVar2,&local_39);
  std::allocator<char>::~allocator(&local_39);
  pcVar2 = *(char **)(sendAddress.field_2._8_8_ + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,pcVar2,(allocator<char> *)(ifaceName.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(ifaceName.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&p_udpSender);
  if (argc == 3) {
    if ((*(long *)(sendAddress.field_2._8_8_ + 8) == 0) ||
       (*(long *)(sendAddress.field_2._8_8_ + 0x10) == 0)) {
      printf("Usage: listen address port. Example receive ff02::5:6 12345\n");
      argv_local._4_4_ = -1;
      local_a4 = 1;
      goto LAB_00104b7a;
    }
    pcVar2 = *(char **)(sendAddress.field_2._8_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c8,pcVar2,&local_c9);
    std::__cxx11::string::operator=(local_38,local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pcVar2 = *(char **)(sendAddress.field_2._8_8_ + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_f0,pcVar2,&local_f1);
    std::__cxx11::string::operator=(local_70,local_f0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    pUVar1 = (UdpTools *)operator_new(0x30);
    UdpTools::UdpTools(pUVar1);
    local_a0 = pUVar1;
  }
  if (argc == 4) {
    if (((*(long *)(sendAddress.field_2._8_8_ + 8) == 0) ||
        (*(long *)(sendAddress.field_2._8_8_ + 0x10) == 0)) ||
       (*(long *)(sendAddress.field_2._8_8_ + 0x18) == 0)) {
      printf("Usage: listen iface-name address port. Example receive eth0 ff02::5:6 12345\n");
      argv_local._4_4_ = -1;
      local_a4 = 1;
      goto LAB_00104b7a;
    }
    pcVar2 = *(char **)(sendAddress.field_2._8_8_ + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_118,pcVar2,&local_119);
    std::__cxx11::string::operator=((string *)&p_udpSender,local_118);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator(&local_119);
    pcVar2 = *(char **)(sendAddress.field_2._8_8_ + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_140,pcVar2,&local_141);
    std::__cxx11::string::operator=(local_38,local_140);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator(&local_141);
    pcVar2 = *(char **)(sendAddress.field_2._8_8_ + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_168,pcVar2,&local_169);
    std::__cxx11::string::operator=(local_70,local_168);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator(&local_169);
    pUVar1 = (UdpTools *)operator_new(0x30);
    message.field_2._M_local_buf[0xf] = '\x01';
    std::__cxx11::string::string((string *)&local_190,(string *)&p_udpSender);
    UdpTools::UdpTools(pUVar1,&local_190);
    message.field_2._M_local_buf[0xf] = '\0';
    local_a0 = pUVar1;
    std::__cxx11::string::~string((string *)&local_190);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"AreYouThere?",&local_1b9);
  std::allocator<char>::~allocator(&local_1b9);
  pUVar1 = local_a0;
  std::__cxx11::string::string((string *)&local_1e0,local_38);
  std::__cxx11::string::string((string *)&local_200,local_70);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  length = std::__cxx11::string::length();
  UdpTools::SendUDPDatagram(pUVar1,true,&local_1e0,&local_200,pcVar2,length);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string(local_1b8);
  local_a4 = 0;
LAB_00104b7a:
  std::__cxx11::string::~string((string *)&p_udpSender);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc < 3) {
		printf("\nUsage: %s <address> <port>\n\nExample: %s ff02::5:6 12345\n\n", argv[0], argv[0]);
		return 1;
	}

	if(argc != 3 && argc != 4)
	{
		printf("Usage: send address port. Example send ff02::5:6 12345\n");
		printf("Usage (need be root): send iface-name address port. Example sudo send eth0 ff02::5:6 12345\n");
		return -1;
	}

	std::string sendAddress = std::string(argv[1]);
	std::string port = std::string(argv[2]);
	std::string ifaceName;
	UdpTools* p_udpSender;

	if(argc == 3)
	{
		if(argv[1] == NULL || argv[2] == NULL)
		{
			printf("Usage: listen address port. Example receive ff02::5:6 12345\n");
			return -1;
		}
		sendAddress = std::string(argv[1]);
		port = std::string(argv[2]);
		p_udpSender = new UdpTools();

	}

	if(argc == 4)
	{
		if(argv[1] == NULL || argv[2] == NULL || argv[3] == NULL)
		{
			printf("Usage: listen iface-name address port. Example receive eth0 ff02::5:6 12345\n");
			return -1;
		}
		ifaceName = std::string(argv[1]);
		sendAddress = std::string(argv[2]);
		port = std::string(argv[3]);
		p_udpSender = new UdpTools(ifaceName);
	}

	std::string message = "AreYouThere?";
	p_udpSender->SendUDPDatagram(true, sendAddress, port, message.c_str(), message.length());

}